

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void * __thiscall
icu_63::Hashtable::put(Hashtable *this,UnicodeString *key,void *value,UErrorCode *status)

{
  UHashtable *hash;
  UnicodeString *this_00;
  void *pvVar1;
  UnicodeString *local_48;
  UErrorCode *status_local;
  void *value_local;
  UnicodeString *key_local;
  Hashtable *this_local;
  
  hash = this->hash;
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)key);
  local_48 = (UnicodeString *)0x0;
  if (this_00 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this_00,key);
    local_48 = this_00;
  }
  pvVar1 = uhash_put_63(hash,local_48,value,status);
  return pvVar1;
}

Assistant:

inline void* Hashtable::put(const UnicodeString& key, void* value, UErrorCode& status) {
    return uhash_put(hash, new UnicodeString(key), value, &status);
}